

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterOperations.cpp
# Opt level: O3

void __thiscall
helics::CloneFilterOperation::setString
          (CloneFilterOperation *this,string_view property,string_view val)

{
  int iVar1;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var2;
  HelicsException *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  long *__s1;
  size_t sVar5;
  size_type __rlen;
  string_view message;
  handle handle;
  basic_string_view<char,_std::char_traits<char>_> local_c0;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_b0;
  unique_lock<std::shared_mutex> local_a8;
  undefined8 uStack_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_c0._M_str = val._M_str;
  local_c0._M_len = val._M_len;
  __s1 = (long *)property._M_str;
  sVar5 = property._M_len;
  if (sVar5 == 0xf) {
    iVar1 = bcmp(__s1,"remove delivery",0xf);
    if (iVar1 != 0) goto LAB_0025d43d;
    local_b0 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &this->deliveryAddresses;
    local_a8._M_device = &(this->deliveryAddresses).m_mutex;
    local_a8._8_8_ = local_a8._8_8_ & 0xffffffffffffff00;
    std::unique_lock<std::shared_mutex>::lock(&local_a8);
    local_a8._M_owns = true;
    _Var2 = std::
            __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::basic_string_view<char,std::char_traits<char>>const>>
                      (*(undefined8 *)local_b0,*(pointer *)(local_b0 + 8),&local_c0);
    if (_Var2._M_current !=
        *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(local_b0 + 8)) {
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_b0,(iterator)_Var2._M_current);
    }
  }
  else if (sVar5 == 0xc) {
    iVar1 = bcmp(__s1,"add delivery",0xc);
    if (iVar1 != 0) goto LAB_0025d43d;
    local_b0 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &this->deliveryAddresses;
    local_a8._M_device = &(this->deliveryAddresses).m_mutex;
    local_a8._8_8_ = local_a8._8_8_ & 0xffffffffffffff00;
    std::unique_lock<std::shared_mutex>::lock(&local_a8);
    local_a8._M_owns = true;
    if (*(long *)local_b0 == *(long *)(local_b0 + 8)) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::basic_string_view<char,std::char_traits<char>>&>(local_b0,&local_c0);
    }
    else {
      _Var2 = std::
              __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::basic_string_view<char,std::char_traits<char>>const>>
                        (*(long *)local_b0,*(long *)(local_b0 + 8),&local_c0);
      if (_Var2._M_current ==
          *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(local_b0 + 8)) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::basic_string_view<char,std::char_traits<char>>&>(local_b0,&local_c0);
      }
    }
  }
  else {
    if ((sVar5 != 8) || (*__s1 != 0x79726576696c6564)) {
LAB_0025d43d:
      this_00 = (HelicsException *)__cxa_allocate_exception(0x28);
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"property ","");
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,__s1,sVar5 + (long)__s1);
      std::operator+(&local_50,&local_90,&local_70);
      pbVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::append(&local_50," is not a known property");
      local_b0 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 (pbVar3->_M_dataplus)._M_p;
      paVar4 = &pbVar3->field_2;
      if (local_b0 == (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)paVar4) {
        local_a8._8_8_ = paVar4->_M_allocated_capacity;
        uStack_98 = *(undefined8 *)((long)&pbVar3->field_2 + 8);
        local_b0 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &local_a8._M_owns;
      }
      else {
        local_a8._8_8_ = paVar4->_M_allocated_capacity;
      }
      local_a8._M_device = (mutex_type *)pbVar3->_M_string_length;
      (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
      pbVar3->_M_string_length = 0;
      (pbVar3->field_2)._M_local_buf[0] = '\0';
      message._M_str = (char *)local_b0;
      message._M_len = (size_t)local_a8._M_device;
      HelicsException::HelicsException(this_00,message);
      *(undefined ***)this_00 = &PTR__HelicsException_0054b1d8;
      __cxa_throw(this_00,&InvalidParameter::typeinfo,HelicsException::~HelicsException);
    }
    local_b0 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &this->deliveryAddresses;
    local_a8._M_device = &(this->deliveryAddresses).m_mutex;
    local_a8._8_8_ = local_a8._8_8_ & 0xffffffffffffff00;
    std::unique_lock<std::shared_mutex>::lock(&local_a8);
    local_a8._M_owns = true;
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase_at_end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_b0,*(pointer *)local_b0);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::basic_string_view<char,std::char_traits<char>>&>(local_b0,&local_c0);
  }
  std::unique_lock<std::shared_mutex>::~unique_lock(&local_a8);
  return;
}

Assistant:

void CloneFilterOperation::setString(std::string_view property, std::string_view val)
{
    if (property == "delivery") {
        auto handle = deliveryAddresses.lock();
        handle->clear();
        handle->emplace_back(val);
    } else if (property == "add delivery") {
        auto handle = deliveryAddresses.lock();
        if (handle->empty()) {
            handle->emplace_back(val);
        } else {
            auto fnd = std::find(handle->cbegin(), handle->cend(), val);
            if (fnd == handle->cend()) {
                handle->emplace_back(val);
            }
        }
    } else if (property == "remove delivery") {
        auto handle = deliveryAddresses.lock();
        auto fnd = std::find(handle->cbegin(), handle->cend(), val);
        if (fnd != handle->cend()) {
            handle->erase(fnd);
        }
    } else {
        throw(helics::InvalidParameter(std::string(
            std::string("property ") + std::string(property) + " is not a known property")));
    }
}